

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LArNEST.cpp
# Opt level: O0

LArYieldResult * __thiscall
NEST::LArNEST::LegacyCalculation
          (LArYieldResult *__return_storage_ptr__,LArNEST *this,int pdgcode,double energy,
          double efield,double density,double track_length)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double recombProb;
  double epsilon;
  double excitationRatio;
  double yieldFactor;
  double track_length_local;
  double density_local;
  double efield_local;
  double energy_local;
  int pdgcode_local;
  LArNEST *this_local;
  
  excitationRatio = 1.0;
  epsilon = 0.21;
  dVar2 = pow(18.0,-2.3333333333333335);
  dVar2 = energy * dVar2 * 11.5;
  iVar1 = pdgcode;
  if (pdgcode < 1) {
    iVar1 = -pdgcode;
  }
  if (iVar1 == 0x840) {
    dVar3 = exp(dVar2 * -5.0);
    excitationRatio = (dVar3 + 1.0) * 0.23;
    dVar3 = pow(efield,0.76313);
    dVar3 = exp(dVar3 * -0.008806);
    epsilon = dVar3 * 0.3065 + 0.69337;
  }
  dVar3 = LegacyGetRecombinationProbability(this,energy,efield,density,pdgcode,track_length);
  LegacyGetYields(__return_storage_ptr__,this,energy,efield,excitationRatio,epsilon,dVar2,dVar3);
  return __return_storage_ptr__;
}

Assistant:

LArYieldResult LArNEST::LegacyCalculation(int pdgcode, double energy,
                                          double efield, double density,
                                          double track_length) {
  // determine various parameter values, such as the
  // yieldfactor, excitationratio, dokebirks parameters,
  // epislon and the recombination probability
  // default quenching factor, for electronic recoils
  double yieldFactor = 1.0;
  // ratio for light particle in LAr, such as e-, mu-, Aprile et. al book
  double excitationRatio = 0.21;

  // nuclear recoil quenching "L" factor: total yield is
  // reduced for nuclear recoil as per Lindhard theory
  double epsilon = 11.5 * (energy * pow(LAr_Z, (-7. / 3.)));
  if (abs(pdgcode) == 2112)  // nuclear recoil
  {
    yieldFactor = 0.23 * (1 + exp(-5 * epsilon));  // liquid argon L_eff
    excitationRatio = 0.69337 + 0.3065 * exp(-0.008806 * pow(efield, 0.76313));
  }
  // get the recombination probability
  double recombProb = LegacyGetRecombinationProbability(energy, efield, density,
                                                        pdgcode, track_length);
  return LegacyGetYields(energy, efield, yieldFactor, excitationRatio, epsilon,
                         recombProb);
}